

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O0

void __thiscall
tcu::ResultCollector::addResult(ResultCollector *this,qpTestResult result,string *msg)

{
  int iVar1;
  int iVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_1a0;
  string *local_20;
  string *msg_local;
  ResultCollector *pRStack_10;
  qpTestResult result_local;
  ResultCollector *this_local;
  
  local_20 = msg;
  msg_local._4_4_ = result;
  pRStack_10 = this;
  if (this->m_log != (TestLog *)0x0) {
    TestLog::operator<<(&local_1a0,this->m_log,(BeginMessageToken *)&TestLog::Message);
    pMVar3 = MessageBuilder::operator<<(&local_1a0,&this->m_prefix);
    pMVar3 = MessageBuilder::operator<<(pMVar3,local_20);
    MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_1a0);
  }
  iVar1 = testResultSeverity(msg_local._4_4_);
  iVar2 = testResultSeverity(this->m_result);
  if (iVar2 < iVar1) {
    this->m_result = msg_local._4_4_;
    std::__cxx11::string::operator=((string *)&this->m_message,(string *)local_20);
  }
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const std::string& msg)
{
	if (m_log != DE_NULL)
		(*m_log) << TestLog::Message << m_prefix << msg << TestLog::EndMessage;

	if (testResultSeverity(result) > testResultSeverity(m_result))
	{
		m_result = result;
		m_message = msg;
	}
}